

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fClippingTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::anon_unknown_0::PolyEdgesTestGroup::init
          (PolyEdgesTestGroup *this,EVP_PKEY_CTX *ctx)

{
  char *pcVar1;
  long lVar2;
  Context *pCVar3;
  int i;
  int extraout_EAX;
  TestNode *pTVar4;
  undefined8 *puVar5;
  long lVar6;
  long lVar7;
  float *pfVar8;
  char *pcVar9;
  ulong uVar10;
  long lVar11;
  int tri;
  uint uVar12;
  undefined1 **description;
  ostringstream *this_00;
  float sqSum;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  Vec3 v2;
  Vec4 halfWhite;
  Vector<float,_3> res_3;
  Vec4 oddSliceColor;
  Vector<float,_3> res_2;
  Vector<float,_3> res_7;
  Vec3 v1;
  EdgeQuad edgeQuads [3];
  ClipPlaneVisit visits [6];
  Quad quads [5];
  Vec3 *in_stack_fffffffffffffc38;
  Vec3 *in_stack_fffffffffffffc40;
  ulong *local_3b0;
  undefined1 *puStack_3a8;
  ulong local_3a0 [2];
  float local_390 [4];
  ulong *local_380;
  long lStack_378;
  ulong local_370 [2];
  TestNode *local_360;
  float local_358 [4];
  float local_348 [4];
  undefined1 local_338 [24];
  undefined1 *puStack_320;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  ulong *local_308;
  undefined1 *puStack_300;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  ulong *local_2e8;
  undefined1 *puStack_2e0;
  float local_2cc;
  float local_2c8;
  float local_2c4;
  TestNode *local_2c0;
  float afStack_2b4 [3];
  long local_2a8;
  size_type *local_2a0;
  char local_298 [72];
  undefined1 *puStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined4 local_230;
  undefined1 *local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  float afStack_210 [2];
  undefined1 *local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined1 *puStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined1 *puStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined1 *local_158;
  undefined1 *local_a8;
  undefined1 *puStack_a0;
  undefined8 local_98;
  undefined1 *puStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined1 *local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  description = &local_a8;
  local_a8 = &DAT_3f8000003f800000;
  puStack_a0 = &DAT_3f8000003f800000;
  local_98 = 0x3f800000bf800000;
  puStack_90 = &DAT_3f8000003f800000;
  local_88 = 0xbf8000003f800000;
  uStack_80 = 0x3f8000003f8ccccd;
  local_78 = &DAT_3f8000003f800000;
  uStack_70 = 0xbf80000000000000;
  local_68 = 0x3f800000;
  uStack_60 = 0x3f80000000000000;
  local_58 = 0x3f80000000000000;
  uStack_50 = 0;
  local_48 = 0x3f80000000000000;
  uStack_40 = 0x3f80000000000000;
  local_38 = 0x3dcccccd;
  local_298[0] = '\0';
  local_298[1] = '\0';
  local_298[2] = -0x80;
  local_298[3] = '?';
  local_298[4] = '\n';
  local_298[5] = -0x29;
  local_298[6] = '#';
  local_298[7] = '<';
  local_298[8] = '\0';
  local_298[9] = '\0';
  local_298[10] = '\0';
  local_298[0xb] = '\0';
  local_298[0xc] = '\0';
  local_298[0xd] = '\0';
  local_298[0xe] = '\0';
  local_298[0xf] = '\0';
  local_298[0x10] = '\n';
  local_298[0x11] = -0x29;
  local_298[0x12] = '#';
  local_298[0x13] = '<';
  local_298[0x14] = '\0';
  local_298[0x15] = '\0';
  local_298[0x16] = '\0';
  local_298[0x17] = '\0';
  local_298[0x18] = '\0';
  local_298[0x19] = '\0';
  local_298[0x1a] = '\0';
  local_298[0x1b] = '\0';
  local_298[0x1c] = -0x5c;
  local_298[0x1d] = 'p';
  local_298[0x1e] = '}';
  local_298[0x1f] = '?';
  local_298[0x20] = '\0';
  local_298[0x21] = '\0';
  local_298[0x22] = '\0';
  local_298[0x23] = '\0';
  local_298[0x24] = '\n';
  local_298[0x25] = -0x29;
  local_298[0x26] = '#';
  local_298[0x27] = '<';
  local_298[0x28] = '\0';
  local_298[0x29] = '\0';
  local_298[0x2a] = -0x80;
  local_298[0x2b] = '?';
  local_298[0x2c] = '\0';
  local_298[0x2d] = '\0';
  local_298[0x2e] = '\0';
  local_298[0x2f] = '\0';
  local_298[0x30] = '\n';
  local_298[0x31] = -0x29;
  local_298[0x32] = '#';
  local_298[0x33] = '<';
  local_298[0x34] = '\0';
  local_298[0x35] = '\0';
  local_298[0x36] = '\0';
  local_298[0x37] = '\0';
  local_298[0x38] = '\0';
  local_298[0x39] = '\0';
  local_298[0x3a] = '\0';
  local_298[0x3b] = '\0';
  local_298[0x3c] = -0x5c;
  local_298[0x3d] = 'p';
  local_298[0x3e] = '}';
  local_298[0x3f] = '?';
  local_298[0x40] = '\0';
  local_298[0x41] = '\0';
  local_298[0x42] = '\0';
  local_298[0x43] = '\0';
  local_298[0x44] = '\0';
  local_298[0x45] = '\0';
  local_298[0x46] = '\0';
  local_298[0x47] = '\0';
  puStack_250 = &DAT_3f8000003f800000;
  local_248 = 0x3c23d70a3c23d70a;
  uStack_240 = 0xbc23d70a;
  local_238 = 0;
  local_230 = 0x3f7d70a4;
  lVar11 = 0;
  local_360 = (TestNode *)this;
  do {
    pTVar4 = (TestNode *)operator_new(0xa0);
    pCVar3 = (Context *)local_360[1]._vptr_TestNode;
    local_3b0 = local_3a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"quad_at_origin_","");
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_228);
    std::ostream::operator<<((ostringstream *)&local_228,(int)lVar11);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_228);
    std::ios_base::~ios_base((ios_base *)&local_1b8);
    uVar10 = 0xf;
    if (local_3b0 != local_3a0) {
      uVar10 = local_3a0[0];
    }
    if (uVar10 < (ulong)(lStack_378 + (long)puStack_3a8)) {
      uVar10 = 0xf;
      if (local_380 != local_370) {
        uVar10 = local_370[0];
      }
      if (uVar10 < (ulong)(lStack_378 + (long)puStack_3a8)) goto LAB_0126d770;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_380,0,(char *)0x0,(ulong)local_3b0);
    }
    else {
LAB_0126d770:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_3b0,(ulong)local_380);
    }
    pcVar9 = (char *)(puVar5 + 2);
    if ((char *)*puVar5 == pcVar9) {
      local_338._16_8_ = *(undefined8 *)pcVar9;
      puStack_320 = (undefined1 *)puVar5[3];
      local_338._0_8_ = local_338 + 0x10;
    }
    else {
      local_338._16_8_ = *(undefined8 *)pcVar9;
      local_338._0_8_ = (char *)*puVar5;
    }
    local_338._8_8_ = puVar5[1];
    *puVar5 = pcVar9;
    puVar5[1] = 0;
    *pcVar9 = '\0';
    local_228 = (undefined1 *)0x0;
    uStack_220 = uStack_220 & 0xffffffff00000000;
    QuadFillTest::QuadFillTest
              ((QuadFillTest *)pTVar4,pCVar3,(char *)local_338._0_8_,(char *)description,
               (WindowRectangle *)((long)description + 0xc),(Vec3 *)&local_228,
               in_stack_fffffffffffffc38,in_stack_fffffffffffffc40);
    tcu::TestNode::addChild(local_360,pTVar4);
    if ((undefined1 *)local_338._0_8_ != local_338 + 0x10) {
      operator_delete((void *)local_338._0_8_,(ulong)(local_338._16_8_ + 1));
    }
    if (local_380 != local_370) {
      operator_delete(local_380,local_370[0] + 1);
    }
    if (local_3b0 != local_3a0) {
      operator_delete(local_3b0,local_3a0[0] + 1);
    }
    lVar11 = lVar11 + 1;
    description = description + 3;
  } while (lVar11 != 5);
  pcVar9 = local_298;
  lVar11 = 0;
  this_00 = (ostringstream *)&local_228;
  do {
    pTVar4 = (TestNode *)operator_new(0xa0);
    pCVar3 = (Context *)local_360[1]._vptr_TestNode;
    local_3b0 = local_3a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"quad_near_edge_","");
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::ostream::operator<<(this_00,(int)lVar11);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base((ios_base *)&local_1b8);
    uVar10 = 0xf;
    if (local_3b0 != local_3a0) {
      uVar10 = local_3a0[0];
    }
    if (uVar10 < (ulong)(lStack_378 + (long)puStack_3a8)) {
      uVar10 = 0xf;
      if (local_380 != local_370) {
        uVar10 = local_370[0];
      }
      if (uVar10 < (ulong)(lStack_378 + (long)puStack_3a8)) goto LAB_0126d964;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_380,0,(char *)0x0,(ulong)local_3b0);
    }
    else {
LAB_0126d964:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_3b0,(ulong)local_380);
    }
    local_338._0_8_ = local_338 + 0x10;
    pcVar1 = (char *)(puVar5 + 2);
    if ((char *)*puVar5 == pcVar1) {
      local_338._16_8_ = *(undefined8 *)pcVar1;
      puStack_320 = (undefined1 *)puVar5[3];
    }
    else {
      local_338._16_8_ = *(undefined8 *)pcVar1;
      local_338._0_8_ = (char *)*puVar5;
    }
    local_338._8_8_ = puVar5[1];
    *puVar5 = pcVar1;
    puVar5[1] = 0;
    *pcVar1 = '\0';
    QuadFillTest::QuadFillTest
              ((QuadFillTest *)pTVar4,pCVar3,(char *)local_338._0_8_,pcVar9,
               (WindowRectangle *)(pcVar9 + 0xc),(Vec3 *)(pcVar9 + 0x18),in_stack_fffffffffffffc38,
               in_stack_fffffffffffffc40);
    tcu::TestNode::addChild(local_360,pTVar4);
    if ((undefined1 *)local_338._0_8_ != local_338 + 0x10) {
      operator_delete((void *)local_338._0_8_,(ulong)(local_338._16_8_ + 1));
    }
    if (local_380 != local_370) {
      operator_delete(local_380,local_370[0] + 1);
    }
    if (local_3b0 != local_3a0) {
      operator_delete(local_3b0,local_3a0[0] + 1);
    }
    lVar11 = lVar11 + 1;
    pcVar9 = pcVar9 + 0x24;
    if (lVar11 == 3) {
      pTVar4 = (TestNode *)operator_new(0xa0);
      pCVar3 = (Context *)local_360[1]._vptr_TestNode;
      tcu::TestCase::TestCase
                ((TestCase *)pTVar4,pCVar3->m_testCtx,"poly_fan","polygon edge clipping");
      ((TestNode *)&pTVar4[1]._vptr_TestNode)->_vptr_TestNode = (_func_int **)pCVar3;
      pTVar4[1].m_testCtx = (TestContext *)0x3200000032;
      pTVar4[1].m_name._M_dataplus._M_p = (pointer)0x6400000064;
      local_2a0 = &pTVar4[1].m_name._M_string_length;
      pTVar4[1].m_name._M_string_length = 0;
      pTVar4[1].m_name.field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&pTVar4[1].m_name.field_2 + 8) = 0;
      ((TestNode *)&pTVar4->_vptr_TestNode)->_vptr_TestNode =
           (_func_int **)&PTR__TriangleFillTest_0218c6d0;
      local_3b0 = (ulong *)&DAT_3f0000003f000000;
      puStack_3a8 = &DAT_3f0000003f000000;
      local_380 = (ulong *)0x0;
      lStack_378 = 0x3f000000;
      lVar11 = (long)&uStack_220 + 4;
      local_228 = &DAT_3f8000003f800000;
      uStack_220 = 0x3f800000;
      local_218 = &DAT_3f8000003f800000;
      afStack_210[0] = 1.0;
      afStack_210[1] = 0.0;
      pfVar8 = afStack_210;
      local_208 = &DAT_3f8000003f800000;
      uStack_200 = 0x3f800000bf800000;
      local_1f8 = 0x3f800000;
      puStack_1f0 = &DAT_3f8000003f800000;
      local_1e8 = 0xbf800000;
      uStack_1e0 = 0xbf8000003f800000;
      local_1d8 = 0x3f800000bf800000;
      uStack_1d0 = 0xbf800000;
      local_1c8 = 0xbf80000000000000;
      uStack_1c0 = 0xbf800000bf800000;
      local_1b8 = 0xbf800000bf800000;
      uStack_1b0 = 0xbf80000000000000;
      local_1a8 = 0xbf800000bf800000;
      uStack_1a0 = 0xbf80000000000000;
      local_198 = 0x3f800000bf800000;
      uStack_190 = 0xbf800000bf800000;
      local_188 = 0xbf80000000000000;
      uStack_180 = 0x3f800000bf800000;
      local_178 = 0xbf80000000000000;
      puStack_170 = &DAT_3f8000003f800000;
      local_168 = 0x3f800000bf800000;
      uStack_160 = 0;
      local_158 = &DAT_3f8000003f800000;
      lVar7 = 0;
      local_2c0 = pTVar4;
      do {
        lVar2 = lVar7 * 0x24;
        uVar12 = 0;
        local_2a8 = lVar7;
        do {
          if (uVar12 == 0) {
            fVar13 = *(float *)((long)&uStack_220 + lVar2 + 4);
            fVar17 = *(float *)((long)&local_218 + lVar2);
            fVar18 = *(float *)((long)&local_218 + lVar2 + 4);
          }
          else {
            local_338._8_8_ = local_338._8_8_ & 0xffffffff00000000;
            local_338._0_4_ = 0.0;
            local_338._4_4_ = 0.0;
            lVar6 = 0;
            do {
              *(float *)(local_338 + lVar6 * 4) =
                   *(float *)(lVar11 + lVar6 * 4) - *(float *)(lVar11 + -0xc + lVar6 * 4);
              lVar6 = lVar6 + 1;
            } while (lVar6 != 3);
            lVar6 = 0;
            do {
              *(float *)(&stack0xfffffffffffffc38 + lVar6 * 4) = pfVar8[lVar6] - pfVar8[lVar6 + -6];
              lVar6 = lVar6 + 1;
            } while (lVar6 != 3);
            lVar6 = 0;
            do {
              afStack_2b4[lVar6] = (float)(int)uVar12 / 40.0;
              lVar6 = lVar6 + 1;
            } while (lVar6 != 3);
            local_358[2] = 0.0;
            local_358[0] = 0.0;
            local_358[1] = 0.0;
            lVar6 = 0;
            do {
              local_358[lVar6] =
                   (1.0 - afStack_2b4[lVar6]) * *(float *)(local_338 + lVar6 * 4) +
                   afStack_2b4[lVar6] * *(float *)(&stack0xfffffffffffffc38 + lVar6 * 4);
              lVar6 = lVar6 + 1;
            } while (lVar6 != 3);
            fVar13 = 0.0;
            lVar6 = 0;
            do {
              fVar13 = fVar13 + local_358[lVar6] * local_358[lVar6];
              lVar6 = lVar6 + 1;
            } while (lVar6 != 3);
            if (fVar13 < 0.0) {
              fVar13 = sqrtf(fVar13);
            }
            else {
              fVar13 = SQRT(fVar13);
            }
            local_348[2] = 0.0;
            local_348[0] = 0.0;
            local_348[1] = 0.0;
            lVar6 = 0;
            do {
              local_348[lVar6] = local_358[lVar6] * (1.0 / fVar13);
              lVar6 = lVar6 + 1;
            } while (lVar6 != 3);
            local_390[2] = 0.0;
            local_390[0] = 0.0;
            local_390[1] = 0.0;
            lVar6 = 0;
            do {
              local_390[lVar6] = *(float *)(this_00 + lVar6 * 4) + local_348[lVar6];
              lVar6 = lVar6 + 1;
            } while (lVar6 != 3);
            fVar13 = local_390[0];
            fVar17 = local_390[1];
            fVar18 = local_390[2];
          }
          if (uVar12 == 0x27) {
            fVar14 = afStack_210[lVar7 * 9];
            fVar15 = afStack_210[lVar7 * 9 + 1];
            fVar16 = *(float *)((long)&local_208 + lVar2);
          }
          else {
            local_338._8_8_ = (ulong)(uint)local_338._12_4_ << 0x20;
            local_338._0_4_ = 0.0;
            local_338._4_4_ = 0.0;
            lVar6 = 0;
            do {
              *(float *)(local_338 + lVar6 * 4) =
                   *(float *)(lVar11 + lVar6 * 4) - *(float *)(lVar11 + -0xc + lVar6 * 4);
              lVar6 = lVar6 + 1;
            } while (lVar6 != 3);
            lVar6 = 0;
            do {
              *(float *)(&stack0xfffffffffffffc38 + lVar6 * 4) = pfVar8[lVar6] - pfVar8[lVar6 + -6];
              lVar6 = lVar6 + 1;
            } while (lVar6 != 3);
            lVar6 = 0;
            do {
              afStack_2b4[lVar6] = (float)(int)(uVar12 + 1) / 40.0;
              lVar6 = lVar6 + 1;
            } while (lVar6 != 3);
            local_358[2] = 0.0;
            local_358[0] = 0.0;
            local_358[1] = 0.0;
            lVar6 = 0;
            do {
              local_358[lVar6] =
                   (1.0 - afStack_2b4[lVar6]) * *(float *)(local_338 + lVar6 * 4) +
                   afStack_2b4[lVar6] * *(float *)(&stack0xfffffffffffffc38 + lVar6 * 4);
              lVar6 = lVar6 + 1;
            } while (lVar6 != 3);
            fVar14 = 0.0;
            lVar6 = 0;
            do {
              fVar14 = fVar14 + local_358[lVar6] * local_358[lVar6];
              lVar6 = lVar6 + 1;
            } while (lVar6 != 3);
            if (fVar14 < 0.0) {
              local_2cc = fVar18;
              local_2c8 = fVar17;
              local_2c4 = fVar13;
              fVar14 = sqrtf(fVar14);
              fVar13 = local_2c4;
              fVar17 = local_2c8;
              fVar18 = local_2cc;
            }
            else {
              fVar14 = SQRT(fVar14);
            }
            local_348[2] = 0.0;
            local_348[0] = 0.0;
            local_348[1] = 0.0;
            lVar6 = 0;
            do {
              local_348[lVar6] = local_358[lVar6] * (1.0 / fVar14);
              lVar6 = lVar6 + 1;
            } while (lVar6 != 3);
            local_390[2] = 0.0;
            local_390[0] = 0.0;
            local_390[1] = 0.0;
            lVar6 = 0;
            do {
              local_390[lVar6] = *(float *)(this_00 + lVar6 * 4) + local_348[lVar6];
              lVar6 = lVar6 + 1;
            } while (lVar6 != 3);
            fVar14 = local_390[0];
            fVar15 = local_390[1];
            fVar16 = local_390[2];
          }
          local_338._0_4_ = 0.0;
          local_338._4_4_ = 0.0;
          local_338._8_4_ = 0.0;
          local_338._12_4_ = 0.0;
          local_338._16_8_ = local_3b0;
          puStack_320 = puStack_3a8;
          if ((uVar12 & 1) == 0) {
            local_338._16_8_ = (ulong *)0x0;
            puStack_320 = (undefined1 *)0x0;
            lVar6 = 0;
            do {
              *(float *)(&stack0xfffffffffffffc38 + lVar6 * 4) =
                   *(float *)((long)&local_3b0 + lVar6 * 4) +
                   *(float *)((long)&local_380 + lVar6 * 4);
              lVar6 = lVar6 + 1;
            } while (lVar6 != 4);
          }
          local_308 = local_3b0;
          puStack_300 = puStack_3a8;
          if ((uVar12 & 1) == 0) {
            local_308 = (ulong *)0x0;
            puStack_300 = (undefined1 *)0x0;
            lVar6 = 0;
            do {
              *(float *)(&stack0xfffffffffffffc38 + lVar6 * 4) =
                   *(float *)((long)&local_3b0 + lVar6 * 4) +
                   *(float *)((long)&local_380 + lVar6 * 4);
              lVar6 = lVar6 + 1;
            } while (lVar6 != 4);
          }
          local_2e8 = local_3b0;
          puStack_2e0 = puStack_3a8;
          if ((uVar12 & 1) == 0) {
            local_2e8 = (ulong *)0x0;
            puStack_2e0 = (undefined1 *)0x0;
            lVar6 = 0;
            do {
              *(float *)(&stack0xfffffffffffffc38 + lVar6 * 4) =
                   *(float *)((long)&local_3b0 + lVar6 * 4) +
                   *(float *)((long)&local_380 + lVar6 * 4);
              lVar6 = lVar6 + 1;
            } while (lVar6 != 4);
          }
          local_338._0_8_ = 0;
          local_338._8_8_ = 0x3f80000000000000;
          fStack_314 = fVar17 * 70000.0;
          local_318 = fVar13 * 70000.0;
          fStack_30c = 1.0;
          fStack_310 = fVar18 * 70000.0;
          fStack_2f4 = fVar15 * 70000.0;
          local_2f8 = fVar14 * 70000.0;
          fStack_2ec = 1.0;
          fStack_2f0 = fVar16 * 70000.0;
          std::
          vector<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
          ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
                       *)local_2a0,(value_type *)local_338);
          uVar12 = uVar12 + 1;
        } while (uVar12 != 0x28);
        lVar7 = local_2a8 + 1;
        lVar11 = lVar11 + 0x24;
        pfVar8 = pfVar8 + 9;
        this_00 = this_00 + 0x24;
      } while (lVar7 != 6);
      tcu::TestNode::addChild(local_360,local_2c0);
      return extraout_EAX;
    }
  } while( true );
}

Assistant:

void PolyEdgesTestGroup::init (void)
{
	// Quads via origin
	const struct Quad
	{
		tcu::Vec3 d1; // tangent
		tcu::Vec3 d2; // bi-tangent
	} quads[] =
	{
		{ tcu::Vec3( 1, 1, 1),	tcu::Vec3( 1,   -1, 1) },
		{ tcu::Vec3( 1, 1, 1),	tcu::Vec3(-1, 1.1f, 1) },
		{ tcu::Vec3( 1, 1, 0),	tcu::Vec3(-1,    1, 0) },
		{ tcu::Vec3( 0, 1, 0),	tcu::Vec3( 1,    0, 0) },
		{ tcu::Vec3( 0, 1, 0),	tcu::Vec3( 1, 0.1f, 0) },
	};

	// Quad near edge
	const struct EdgeQuad
	{
		tcu::Vec3 d1;		// tangent
		tcu::Vec3 d2;		// bi-tangent
		tcu::Vec3 center;	// center
	} edgeQuads[] =
	{
		{ tcu::Vec3( 1,     0.01f, 0    ),	tcu::Vec3( 0,      0.01f,  0),  tcu::Vec3( 0,     0.99f, 0    ) }, // edge near x-plane
		{ tcu::Vec3( 0.01f, 1,     0    ),	tcu::Vec3( 0.01f,  0,      0),  tcu::Vec3( 0.99f, 0,     0    ) }, // edge near y-plane
		{ tcu::Vec3( 1,     1,     0.01f),	tcu::Vec3( 0.01f,  -0.01f, 0),  tcu::Vec3( 0,     0,     0.99f) }, // edge near z-plane
	};

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(quads); ++ndx)
		addChild(new QuadFillTest(m_context, (std::string("quad_at_origin_") + de::toString(ndx)).c_str(), "polygon edge clipping", VIEWPORT_CENTER, quads[ndx].d1, quads[ndx].d2));
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(edgeQuads); ++ndx)
		addChild(new QuadFillTest(m_context, (std::string("quad_near_edge_") + de::toString(ndx)).c_str(), "polygon edge clipping", VIEWPORT_CENTER, edgeQuads[ndx].d1, edgeQuads[ndx].d2, edgeQuads[ndx].center));

	// Polyfan
	addChild(new TriangleFanFillTest(m_context, "poly_fan", "polygon edge clipping", VIEWPORT_CENTER));
}